

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O1

bool __thiscall Rml::Context::Render(Context *this)

{
  int iVar1;
  Vector2f offset;
  int iVar2;
  int iVar3;
  
  RenderManager::PrepareRender(this->render_manager,this->dimensions);
  Element::Render((this->root)._M_t.
                  super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                  super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                  super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl);
  if (this->drag_clone != (Element *)0x0) {
    ElementDocument::UpdateDocument
              ((ElementDocument *)
               (this->cursor_proxy)._M_t.
               super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
               super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
               super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl);
    iVar2 = (this->mouse_position).x;
    iVar3 = (this->dimensions).x;
    if (iVar2 < iVar3) {
      iVar3 = iVar2;
    }
    if (iVar2 < 0) {
      iVar3 = 0;
    }
    iVar2 = (this->dimensions).y;
    iVar1 = (this->mouse_position).y;
    if (iVar1 < iVar2) {
      iVar2 = iVar1;
    }
    if (iVar1 < 0) {
      iVar2 = 0;
    }
    offset.y = (float)iVar2;
    offset.x = (float)iVar3;
    Element::SetOffset((this->cursor_proxy)._M_t.
                       super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                       super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                       super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,offset,
                       (Element *)0x0,false);
    Element::Render((this->cursor_proxy)._M_t.
                    super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                    super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                    super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl);
  }
  RenderManager::ResetState(this->render_manager);
  return true;
}

Assistant:

bool Context::Render()
{
	RMLUI_ZoneScoped;

	render_manager->PrepareRender(dimensions);

	root->Render();

	// Render the cursor proxy so that any attached drag clone will be rendered below the cursor.
	if (drag_clone)
	{
		static_cast<ElementDocument&>(*cursor_proxy).UpdateDocument();
		cursor_proxy->SetOffset(
			Vector2f((float)Math::Clamp(mouse_position.x, 0, dimensions.x), (float)Math::Clamp(mouse_position.y, 0, dimensions.y)), nullptr);
		cursor_proxy->Render();
	}

	render_manager->ResetState();

	return true;
}